

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * cppcms::util::escape(string *__return_storage_ptr__,string *s)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = s->_M_string_length;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if ((int)uVar2 != 0) {
    uVar3 = 0;
    do {
      bVar1 = (s->_M_dataplus)._M_p[uVar3];
      if (bVar1 < 0x27) {
        if ((bVar1 != 0x22) && (bVar1 != 0x26)) goto LAB_001e3791;
LAB_001e377f:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if ((bVar1 == 0x27) || ((bVar1 == 0x3c || (bVar1 == 0x3e)))) goto LAB_001e377f;
LAB_001e3791:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0xffffffff) != uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string escape(std::string const &s)
{
	std::string content;
	unsigned i,len=s.size();
	content.reserve(len*3/2);
	for(i=0;i<len;i++) {
		char c=s[i];
		switch(c){
			case '<': content+="&lt;"; break;
			case '>': content+="&gt;"; break;
			case '&': content+="&amp;"; break;
			case '\"': content+="&quot;"; break;
			case '\'': content+="&#39;"; break;
			default: content+=c;
		}
	}
	return content;
}